

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

string * gl3cts::TransformFeedback::Utilities::preprocessCode
                   (string *__return_storage_ptr__,string *source,string *key,string *value)

{
  pointer pcVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + source->_M_string_length);
  do {
    uVar2 = std::__cxx11::string::find
                      ((char *)__return_storage_ptr__,(ulong)(key->_M_dataplus)._M_p,0);
    if (uVar2 == 0xffffffffffffffff) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar2,(char *)key->_M_string_length,
               (ulong)(value->_M_dataplus)._M_p);
  } while (uVar2 != 0xffffffffffffffff);
  return __return_storage_ptr__;
}

Assistant:

std::string gl3cts::TransformFeedback::Utilities::preprocessCode(std::string source, std::string key, std::string value)
{
	std::string destination = source;

	while (true)
	{
		/* Find token in source code. */
		size_t position = destination.find(key, 0);

		/* No more occurences of this key. */
		if (position == std::string::npos)
		{
			break;
		}

		/* Replace token with sub_code. */
		destination.replace(position, key.size(), value);
	}

	return destination;
}